

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrLDY0xac(CPU *this)

{
  Memory *this_00;
  byte bVar1;
  uint16_t uVar2;
  
  this_00 = this->m;
  uVar2 = this->PC;
  this->PC = uVar2 + 2;
  uVar2 = Memory::Read16(this_00,uVar2);
  bVar1 = Memory::Read8(this_00,uVar2);
  this->Y = bVar1;
  this->field_0x2e = bVar1 >> 7 | (bVar1 == 0) << 6 | this->field_0x2e & 0xbe;
  return 4;
}

Assistant:

int CPU::instrLDY0xac() {
	LDY(absolute_addr());
	return 4;
}